

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O0

_Bool uint_tbl_next_at(uint_tbl *tbl,uint key,uint *pkey,void **pentry)

{
  void **pentry_local;
  uint *pkey_local;
  uint key_local;
  uint_tbl *tbl_local;
  
  pkey_local._4_4_ = key;
  while( true ) {
    if (tbl->nrows <= pkey_local._4_4_) {
      *pkey = 0xffffffff;
      *pentry = (void *)0x0;
      return false;
    }
    if (tbl->rows[pkey_local._4_4_] != (void *)0x0) break;
    pkey_local._4_4_ = pkey_local._4_4_ + 1;
  }
  *pkey = pkey_local._4_4_;
  *pentry = tbl->rows[pkey_local._4_4_];
  return true;
}

Assistant:

static bool uint_tbl_next_at(struct uint_tbl *tbl, unsigned int key,
                             unsigned int *pkey, void **pentry)
{
  for(; key < tbl->nrows; ++key) {
    if(tbl->rows[key]) {
      *pkey = key;
      *pentry = tbl->rows[key];
      return TRUE;
    }
  }
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}